

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

void luaO_arith(lua_State *L,int op,TValue *p1,TValue *p2,TValue *res)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  TValue *io;
  lua_Number *plVar4;
  TValue *pTVar5;
  lua_Number lVar6;
  lua_Integer i1;
  lua_Integer i2;
  
  if ((uint)op < 0xe) {
    if ((0x2f80U >> (op & 0x1fU) & 1) == 0) {
      if ((0x30U >> (op & 0x1fU) & 1) == 0) goto LAB_0011611a;
      if (p1->tt_ == 3) {
        i1 = (p1->value_).i;
        iVar1 = op;
      }
      else {
        plVar4 = (lua_Number *)&i1;
        iVar2 = luaV_tonumber_(p1,plVar4);
        iVar1 = (int)plVar4;
        if (iVar2 == 0) goto LAB_001161e2;
      }
      pTVar5 = p2;
      if (p2->tt_ == 3) {
LAB_00116160:
        lVar6 = numarith((lua_State *)(ulong)(uint)op,iVar1,(lua_Number)i1,(pTVar5->value_).n);
        (res->value_).n = lVar6;
        res->tt_ = 3;
        return;
      }
      pTVar5 = (TValue *)&i2;
      iVar2 = luaV_tonumber_(p2,(lua_Number *)&i2);
      iVar1 = (int)pTVar5;
      pTVar5 = (TValue *)&i2;
      if (iVar2 != 0) goto LAB_00116160;
    }
    else {
      if (p1->tt_ == 0x13) {
        i1 = (p1->value_).i;
      }
      else {
        iVar1 = luaV_tointeger(p1,&i1,0);
        if (iVar1 == 0) goto LAB_001161e2;
      }
      if (p2->tt_ == 0x13) {
        i2 = (p2->value_).i;
LAB_001160db:
        lVar3 = intarith(L,op,i1,i2);
        (res->value_).i = lVar3;
        res->tt_ = 0x13;
        return;
      }
      iVar1 = luaV_tointeger(p2,&i2,0);
      if (iVar1 != 0) goto LAB_001160db;
    }
LAB_001161e2:
    luaT_trybinTM(L,p1,p2,res,op + TM_ADD);
  }
  else {
LAB_0011611a:
    if (p1->tt_ == 3) {
      i1 = (p1->value_).i;
      iVar1 = op;
LAB_0011619f:
      pTVar5 = p2;
      if (p2->tt_ != 3) {
        pTVar5 = (TValue *)&i2;
        iVar2 = luaV_tonumber_(p2,(lua_Number *)&i2);
        iVar1 = (int)pTVar5;
        pTVar5 = (TValue *)&i2;
        if (iVar2 == 0) goto LAB_001161e2;
      }
      lVar6 = numarith((lua_State *)(ulong)(uint)op,iVar1,(lua_Number)i1,(pTVar5->value_).n);
      iVar1 = 3;
    }
    else {
      if ((p1->tt_ != 0x13) || (p2->tt_ != 0x13)) {
        plVar4 = (lua_Number *)&i1;
        iVar2 = luaV_tonumber_(p1,plVar4);
        iVar1 = (int)plVar4;
        if (iVar2 == 0) goto LAB_001161e2;
        goto LAB_0011619f;
      }
      lVar6 = (lua_Number)intarith(L,op,(p1->value_).i,(p2->value_).i);
      iVar1 = 0x13;
    }
    (res->value_).i = (lua_Integer)lVar6;
    res->tt_ = iVar1;
  }
  return;
}

Assistant:

void luaO_arith (lua_State *L, int op, const TValue *p1, const TValue *p2,
                 TValue *res) {
  switch (op) {
    case LUA_OPBAND: case LUA_OPBOR: case LUA_OPBXOR:
    case LUA_OPSHL: case LUA_OPSHR:
    case LUA_OPBNOT: {  /* operate only on integers */
      lua_Integer i1; lua_Integer i2;
      if (tointeger(p1, &i1) && tointeger(p2, &i2)) {
        setivalue(res, intarith(L, op, i1, i2));
        return;
      }
      else break;  /* go to the end */
    }
    case LUA_OPDIV: case LUA_OPPOW: {  /* operate only on floats */
      lua_Number n1; lua_Number n2;
      if (tonumber(p1, &n1) && tonumber(p2, &n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return;
      }
      else break;  /* go to the end */
    }
    default: {  /* other operations */
      lua_Number n1; lua_Number n2;
      if (ttisinteger(p1) && ttisinteger(p2)) {
        setivalue(res, intarith(L, op, ivalue(p1), ivalue(p2)));
        return;
      }
      else if (tonumber(p1, &n1) && tonumber(p2, &n2)) {
        setfltvalue(res, numarith(L, op, n1, n2));
        return;
      }
      else break;  /* go to the end */
    }
  }
  /* could not perform raw operation; try metamethod */
  lua_assert(L != NULL);  /* should not fail when folding (compile time) */
  luaT_trybinTM(L, p1, p2, res, cast(TMS, (op - LUA_OPADD) + TM_ADD));
}